

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O3

char * pdgui_strnescape(char *dst,size_t dstlen,char *src,size_t srclen)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = 0;
  if (src == (char *)0x0 || dst == (char *)0x0) {
    return (char *)0x0;
  }
  uVar1 = dstlen - 1;
  uVar6 = 1;
  do {
    bVar2 = src[uVar6 - 1];
    if ((bVar2 - 0x5b < 0x23) && ((0x500000007U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)) {
      uVar4 = uVar5 + 1;
      dst[uVar5] = '\\';
      if (uVar1 < uVar4) {
        dst[uVar5] = '\0';
        uVar5 = uVar4;
LAB_001777e3:
        uVar3 = dstlen - 1;
        if (uVar5 <= uVar1) {
          uVar3 = (ulong)uVar5;
        }
        dst[uVar3] = '\0';
        return dst;
      }
      dst[uVar4] = bVar2;
      uVar5 = uVar5 + 2;
    }
    else {
      dst[uVar5] = bVar2;
      uVar5 = uVar5 + 1;
      if (bVar2 == 0) goto LAB_001777e3;
    }
    if ((srclen - 1 < (ulong)uVar6) || (uVar6 = uVar6 + 1, uVar1 < uVar5)) goto LAB_001777e3;
  } while( true );
}

Assistant:

char* pdgui_strnescape(char *dst, size_t dstlen, const char *src, size_t srclen)
{
    unsigned ptin = 0, ptout = 0;
    if(!dst || !src)return 0;
    while(1)
    {
        int c = src[ptin];
        if (c == '\\' || c == '{' || c == '}' || c == '[' || c == ']') {
            dst[ptout++] = '\\';
            if (dstlen && ptout >= dstlen){
                dst[ptout-1] = 0;
                break;
            }
        }
        dst[ptout] = c;
        ptin++;
        ptout++;
        if (c==0) break;
        if (srclen && ptin  >= srclen) break;
        if (dstlen && ptout >= dstlen) break;
    }

    if(!dstlen || ptout < dstlen)
        dst[ptout]=0;
    else
        dst[dstlen-1]=0;

    return dst;
}